

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# co_hook_sys_call.cpp
# Opt level: O2

rpchook_t * alloc_by_fd(int fd)

{
  rpchook_t *prVar1;
  
  if (fd < 1000000) {
    prVar1 = (rpchook_t *)calloc(1,0x38);
    (prVar1->read_timeout).tv_sec = 0x28;
    (prVar1->write_timeout).tv_sec = 10;
    g_rpchook_socket_fd[(uint)fd] = prVar1;
    return prVar1;
  }
  return (rpchook_t *)0x0;
}

Assistant:

static inline rpchook_t * alloc_by_fd( int fd )
{
	if( fd > -1 && fd < (int)sizeof(g_rpchook_socket_fd) / (int)sizeof(g_rpchook_socket_fd[0]) )
	{
		rpchook_t *lp = (rpchook_t*)calloc( 1,sizeof(rpchook_t) );
		lp->read_timeout.tv_sec = 40;
		lp->write_timeout.tv_sec = 10;
		g_rpchook_socket_fd[ fd ] = lp;
		return lp;
	}
	return NULL;
}